

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

string * ApprovalTests::StringUtils::leftTrim(string *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  string *in_RSI;
  string *in_RDI;
  string *this;
  undefined8 local_28;
  undefined8 local_18;
  
  this = in_RDI;
  ::std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RSI,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  uVar1 = ::std::__cxx11::string::begin();
  uVar2 = ::std::__cxx11::string::end();
  ::std::
  find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ApprovalTests::StringUtils::leftTrim(std::__cxx11::string)::__0>
            (uVar1,uVar2);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RSI,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this);
  ::std::__cxx11::string::erase(in_RSI,local_18,local_28);
  ::std::__cxx11::string::string(this,in_RSI);
  return in_RDI;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::leftTrim(std::string s)
    {

        s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](unsigned char ch) {
                    return !std::isspace(ch);
                }));
        return s;
    }